

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip.c
# Opt level: O0

void zip_close(zip_t *zip)

{
  zip_t *zip_local;
  
  if (zip != (zip_t *)0x0) {
    mz_zip_writer_finalize_archive(&zip->archive);
    mz_zip_writer_end(&zip->archive);
    mz_zip_reader_end(&zip->archive);
    if (zip != (zip_t *)0x0) {
      free(zip);
    }
  }
  return;
}

Assistant:

void zip_close(struct zip_t *zip) {
  if (zip) {
    // Always finalize, even if adding failed for some reason, so we have a
    // valid central directory.
    mz_zip_writer_finalize_archive(&(zip->archive));

    mz_zip_writer_end(&(zip->archive));
    mz_zip_reader_end(&(zip->archive));

    CLEANUP(zip);
  }
}